

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIStaticText.cpp
# Opt level: O0

SColor __thiscall irr::gui::CGUIStaticText::getActiveColor(CGUIStaticText *this)

{
  byte bVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long *in_RDI;
  IGUISkin *skin;
  u32 local_4;
  
  if ((*(byte *)((long)in_RDI + 0x13d) & 1) == 0) {
    puVar2 = (undefined8 *)(**(code **)(*(long *)in_RDI[0x25] + 0x60))();
    if (puVar2 == (undefined8 *)0x0) {
      local_4 = *(u32 *)((long)in_RDI + 0x144);
    }
    else if ((*(byte *)((long)in_RDI + 0x13d) & 1) == 0) {
      bVar1 = (**(code **)(*in_RDI + 0x90))();
      uVar3 = 9;
      if ((bVar1 & 1) != 0) {
        uVar3 = 8;
      }
      local_4 = (**(code **)*puVar2)(puVar2,uVar3);
    }
    else {
      local_4 = *(u32 *)((long)in_RDI + 0x144);
    }
  }
  else {
    local_4 = *(u32 *)((long)in_RDI + 0x144);
  }
  return (SColor)local_4;
}

Assistant:

irr::video::SColor CGUIStaticText::getActiveColor() const
{
	if (OverrideColorEnabled)
		return OverrideColor;
	IGUISkin *skin = Environment->getSkin();
	if (skin)
		return OverrideColorEnabled ? OverrideColor : skin->getColor(isEnabled() ? EGDC_BUTTON_TEXT : EGDC_GRAY_TEXT);
	return OverrideColor;
}